

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O1

void __thiscall
vkt::sr::anon_unknown_0::TextureQueryInstance::setupDefaultInputs(TextureQueryInstance *this)

{
  float positions [16];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_18 = 0x3f8000003f800000;
  uStack_10 = 0x3f80000000000000;
  local_28 = 0xbf8000003f800000;
  uStack_20 = 0x3f80000000000000;
  local_38 = 0x3f800000bf800000;
  uStack_30 = 0x3f80000000000000;
  local_48 = 0xbf800000bf800000;
  uStack_40 = 0x3f80000000000000;
  ShaderRenderCaseInstance::addAttribute
            (&this->super_ShaderRenderCaseInstance,0,VK_FORMAT_R32G32B32A32_SFLOAT,0x10,4,&local_48)
  ;
  return;
}

Assistant:

void TextureQueryInstance::setupDefaultInputs (void)
{
	const deUint32		numVertices		= 4;
	const float			positions[]		=
	{
		-1.0f, -1.0f, 0.0f, 1.0f,
		-1.0f,  1.0f, 0.0f, 1.0f,
		 1.0f, -1.0f, 0.0f, 1.0f,
		 1.0f,  1.0f, 0.0f, 1.0f
	};

	addAttribute(0u, vk::VK_FORMAT_R32G32B32A32_SFLOAT, 4 * (deUint32)sizeof(float), numVertices, positions);
}